

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Ok> *
wasm::WATParser::import_<wasm::WATParser::ParseModuleTypesCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  __index_type *p_Var1;
  __index_type *__return_storage_ptr___00;
  __index_type *__return_storage_ptr___01;
  __index_type *__return_storage_ptr___02;
  GlobalType type_00;
  Name NVar2;
  Name NVar3;
  Name NVar4;
  Name name_00;
  bool bVar5;
  size_t sVar6;
  Name *pNVar7;
  Type *pTVar8;
  GlobalType *pGVar9;
  Err *pEVar10;
  TypeUse *pTVar11;
  basic_string_view<char,_std::char_traits<char>_> bVar12;
  Ok local_822;
  allocator<char> local_821;
  string local_820;
  Err local_800;
  allocator<char> local_7d9;
  string local_7d8;
  Err local_7b8;
  allocator<char> local_791;
  string local_790;
  Err local_770;
  Err local_750;
  Err *local_730;
  Err *err_9;
  vector<wasm::Name,_std::allocator<wasm::Name>_> local_708;
  Name local_6f0;
  undefined1 local_6e0 [8];
  Result<wasm::Ok> _val_9;
  Err *err_8;
  Result<wasm::WATParser::TypeUse> _val_8;
  Result<wasm::WATParser::TypeUse> type_4;
  optional<wasm::Name> name_4;
  Err local_618;
  Err *local_5f8;
  Err *err_7;
  Mutability local_5e8;
  undefined4 uStack_5e4;
  undefined4 uStack_5e0;
  undefined4 uStack_5dc;
  vector<wasm::Name,_std::allocator<wasm::Name>_> local_5d8;
  Name local_5c0;
  undefined1 local_5b0 [8];
  Result<wasm::Ok> _val_7;
  Err *err_6;
  Result<wasm::WATParser::GlobalType> _val_6;
  Result<wasm::WATParser::GlobalType> type_3;
  optional<wasm::Name> name_3;
  Err local_4e8;
  Err *local_4c8;
  Err *err_5;
  vector<wasm::Name,_std::allocator<wasm::Name>_> local_4b8;
  Name local_4a0;
  undefined1 local_490 [8];
  Result<wasm::Ok> _val_5;
  Err *err_4;
  Result<wasm::Ok> _val_4;
  Result<wasm::Ok> type_2;
  optional<wasm::Name> name_2;
  Err local_3c8;
  Err *local_3a8;
  Err *err_3;
  vector<wasm::Name,_std::allocator<wasm::Name>_> local_398;
  Name local_378;
  undefined1 local_368 [8];
  Result<wasm::Ok> _val_3;
  Err *err_2;
  Result<wasm::Type> _val_2;
  Result<wasm::Type> type_1;
  optional<wasm::Name> name_1;
  Err local_2a0;
  Err *local_280;
  Err *err_1;
  pointer pAStack_270;
  pointer local_268;
  optional<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> local_258;
  TypeUse local_238;
  vector<wasm::Name,_std::allocator<wasm::Name>_> local_218;
  Name local_200;
  undefined1 local_1f0 [8];
  Result<wasm::Ok> _val_1;
  Err local_1c0;
  Err *local_1a0;
  Err *err;
  Result<wasm::WATParser::TypeUse> _val;
  Result<wasm::WATParser::TypeUse> type;
  optional<wasm::Name> name;
  undefined1 local_120 [8];
  ImportNames names;
  string local_f8;
  Err local_d8;
  undefined1 local_b8 [8];
  optional<wasm::Name> nm;
  allocator<char> local_89;
  string local_88;
  Err local_68;
  undefined1 local_48 [8];
  optional<wasm::Name> mod;
  Index local_20;
  size_t pos;
  ParseModuleTypesCtx *ctx_local;
  
  sVar6 = Lexer::getPos(&ctx->in);
  join_0x00000010_0x00000000_ = sv("import",6);
  bVar5 = Lexer::takeSExprStart(&ctx->in,join_0x00000010_0x00000000_);
  if (bVar5) {
    Lexer::takeName((optional<wasm::Name> *)local_48,&ctx->in);
    bVar5 = std::optional::operator_cast_to_bool((optional *)local_48);
    if (bVar5) {
      Lexer::takeName((optional<wasm::Name> *)local_b8,&ctx->in);
      bVar5 = std::optional::operator_cast_to_bool((optional *)local_b8);
      if (bVar5) {
        pNVar7 = std::optional<wasm::Name>::operator*((optional<wasm::Name> *)local_48);
        local_120 = (undefined1  [8])(pNVar7->super_IString).str._M_len;
        names.mod.super_IString.str._M_len = (size_t)(pNVar7->super_IString).str._M_str;
        pNVar7 = std::optional<wasm::Name>::operator*((optional<wasm::Name> *)local_b8);
        names.mod.super_IString.str._M_str = (char *)(pNVar7->super_IString).str._M_len;
        names.nm.super_IString.str._M_len = (size_t)(pNVar7->super_IString).str._M_str;
        bVar12 = sv("func",4);
        bVar5 = Lexer::takeSExprStart(&ctx->in,bVar12);
        local_20 = (Index)sVar6;
        if (bVar5) {
          Lexer::takeID((optional<wasm::Name> *)
                        ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                        &ctx->in);
          p_Var1 = (__index_type *)
                   ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20);
          typeuse<wasm::WATParser::ParseModuleTypesCtx>
                    ((Result<wasm::WATParser::TypeUse> *)p_Var1,ctx,true);
          Result<wasm::WATParser::TypeUse>::Result
                    ((Result<wasm::WATParser::TypeUse> *)&err,
                     (Result<wasm::WATParser::TypeUse> *)p_Var1);
          local_1a0 = Result<wasm::WATParser::TypeUse>::getErr
                                ((Result<wasm::WATParser::TypeUse> *)&err);
          _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = local_1a0 != (Err *)0x0;
          if ((bool)_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_) {
            wasm::Err::Err(&local_1c0,local_1a0);
            MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_1c0);
            wasm::Err::~Err(&local_1c0);
          }
          _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
          Result<wasm::WATParser::TypeUse>::~Result((Result<wasm::WATParser::TypeUse> *)&err);
          if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
            bVar5 = std::optional::operator_cast_to_bool
                              ((optional *)
                               ((long)&type.val.
                                       super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                       super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                       .super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> +
                               0x20));
            if (bVar5) {
              pNVar7 = std::optional<wasm::Name>::operator*
                                 ((optional<wasm::Name> *)
                                  ((long)&type.val.
                                          super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                          super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                          .
                                          super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                          .
                                          super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                          .
                                          super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                  + 0x20));
              local_200.super_IString.str._M_len = (pNVar7->super_IString).str._M_len;
              local_200.super_IString.str._M_str = (pNVar7->super_IString).str._M_str;
            }
            else {
              wasm::Name::Name(&local_200);
            }
            local_218.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_218.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_218.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector(&local_218);
            pTVar11 = Result<wasm::WATParser::TypeUse>::operator*
                                ((Result<wasm::WATParser::TypeUse> *)
                                 ((long)&_val.val.
                                         super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                         super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                         .
                                         super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                         .
                                         super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                         .
                                         super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                 + 0x20));
            TypeUse::TypeUse(&local_238,pTVar11);
            std::optional<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>::optional()
            ;
            err_1 = (Err *)0x0;
            pAStack_270 = (pointer)0x0;
            local_268 = (pointer)0x0;
            std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
            vector((vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                    *)&err_1);
            name_00.super_IString.str._M_str = local_200.super_IString.str._M_str;
            name_00.super_IString.str._M_len = local_200.super_IString.str._M_len;
            ParseModuleTypesCtx::addFunc
                      ((Result<wasm::Ok> *)local_1f0,ctx,name_00,&local_218,(ImportNames *)local_120
                       ,&local_238,&local_258,
                       (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                        *)&err_1,local_20);
            std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
            ~vector((vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                     *)&err_1);
            std::optional<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>::~optional
                      (&local_258);
            TypeUse::~TypeUse(&local_238);
            std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector(&local_218);
            local_280 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_1f0);
            bVar5 = local_280 != (Err *)0x0;
            if (bVar5) {
              wasm::Err::Err(&local_2a0,local_280);
              MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_2a0);
              wasm::Err::~Err(&local_2a0);
            }
            _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
            _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = bVar5;
            Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_1f0);
            if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
              _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 0;
            }
          }
          Result<wasm::WATParser::TypeUse>::~Result
                    ((Result<wasm::WATParser::TypeUse> *)
                     ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
        }
        else {
          bVar12 = sv("table",5);
          bVar5 = Lexer::takeSExprStart(&ctx->in,bVar12);
          if (bVar5) {
            Lexer::takeID((optional<wasm::Name> *)
                          ((long)&type_1.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),&ctx->in);
            __return_storage_ptr___00 =
                 (__index_type *)
                 ((long)&_val_2.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20);
            tabletype<wasm::WATParser::ParseModuleTypesCtx>
                      ((Result<wasm::Type> *)__return_storage_ptr___00,ctx);
            Result<wasm::Type>::Result
                      ((Result<wasm::Type> *)&err_2,(Result<wasm::Type> *)__return_storage_ptr___00)
            ;
            pEVar10 = Result<wasm::Type>::getErr((Result<wasm::Type> *)&err_2);
            if (pEVar10 != (Err *)0x0) {
              wasm::Err::Err((Err *)((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                             pEVar10);
              MaybeResult<wasm::Ok>::MaybeResult
                        (__return_storage_ptr__,
                         (Err *)((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              wasm::Err::~Err((Err *)((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            }
            _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
            _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = pEVar10 != (Err *)0x0;
            Result<wasm::Type>::~Result((Result<wasm::Type> *)&err_2);
            if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
              bVar5 = std::optional::operator_cast_to_bool
                                ((optional *)
                                 ((long)&type_1.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                         super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
              if (bVar5) {
                pNVar7 = std::optional<wasm::Name>::operator*
                                   ((optional<wasm::Name> *)
                                    ((long)&type_1.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                            super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                            super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                            super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                            super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
                local_378.super_IString.str._M_len = (pNVar7->super_IString).str._M_len;
                local_378.super_IString.str._M_str = (pNVar7->super_IString).str._M_str;
              }
              else {
                wasm::Name::Name(&local_378);
              }
              local_398.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_398.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_398.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector(&local_398);
              pTVar8 = Result<wasm::Type>::operator*
                                 ((Result<wasm::Type> *)
                                  ((long)&_val_2.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                          super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                          super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
              err_3 = (Err *)pTVar8->id;
              NVar4.super_IString.str._M_str = local_378.super_IString.str._M_str;
              NVar4.super_IString.str._M_len = local_378.super_IString.str._M_len;
              ParseModuleTypesCtx::addTable
                        ((Result<wasm::Ok> *)local_368,ctx,NVar4,&local_398,(ImportNames *)local_120
                         ,(Type)err_3,local_20);
              std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector(&local_398);
              local_3a8 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_368);
              bVar5 = local_3a8 != (Err *)0x0;
              if (bVar5) {
                wasm::Err::Err(&local_3c8,local_3a8);
                MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_3c8);
                wasm::Err::~Err(&local_3c8);
              }
              _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
              _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = bVar5;
              Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_368);
              if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
                _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 0;
              }
            }
            Result<wasm::Type>::~Result
                      ((Result<wasm::Type> *)
                       ((long)&_val_2.val.super__Variant_base<wasm::Type,_wasm::Err>.
                               super__Move_assign_alias<wasm::Type,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
          }
          else {
            bVar12 = sv("memory",6);
            bVar5 = Lexer::takeSExprStart(&ctx->in,bVar12);
            if (bVar5) {
              Lexer::takeID((optional<wasm::Name> *)
                            ((long)&type_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),&ctx->in);
              __return_storage_ptr___01 =
                   (__index_type *)
                   ((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
              memtype<wasm::WATParser::ParseModuleTypesCtx>
                        ((Result<wasm::Ok> *)__return_storage_ptr___01,ctx);
              Result<wasm::Ok>::Result
                        ((Result<wasm::Ok> *)&err_4,(Result<wasm::Ok> *)__return_storage_ptr___01);
              pEVar10 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_4);
              if (pEVar10 != (Err *)0x0) {
                wasm::Err::Err((Err *)((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                               pEVar10);
                MaybeResult<wasm::Ok>::MaybeResult
                          (__return_storage_ptr__,
                           (Err *)((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
                wasm::Err::~Err((Err *)((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              }
              _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
              _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = pEVar10 != (Err *)0x0;
              Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_4);
              if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
                bVar5 = std::optional::operator_cast_to_bool
                                  ((optional *)
                                   ((long)&type_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
                if (bVar5) {
                  pNVar7 = std::optional<wasm::Name>::operator*
                                     ((optional<wasm::Name> *)
                                      ((long)&type_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
                  local_4a0.super_IString.str._M_len = (pNVar7->super_IString).str._M_len;
                  local_4a0.super_IString.str._M_str = (pNVar7->super_IString).str._M_str;
                }
                else {
                  wasm::Name::Name(&local_4a0);
                }
                local_4b8.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_4b8.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_4b8.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector(&local_4b8);
                Result<wasm::Ok>::operator*
                          ((Result<wasm::Ok> *)
                           ((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
                ParseModuleTypesCtx::addMemory
                          (local_490,ctx,local_4a0.super_IString.str._M_len,
                           local_4a0.super_IString.str._M_str,&local_4b8,local_120,local_20);
                std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector(&local_4b8);
                local_4c8 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_490);
                bVar5 = local_4c8 != (Err *)0x0;
                if (bVar5) {
                  wasm::Err::Err(&local_4e8,local_4c8);
                  MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_4e8);
                  wasm::Err::~Err(&local_4e8);
                }
                _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
                _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = bVar5;
                Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_490);
                if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
                  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 0;
                }
              }
              Result<wasm::Ok>::~Result
                        ((Result<wasm::Ok> *)
                         ((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            }
            else {
              bVar12 = sv("global",6);
              bVar5 = Lexer::takeSExprStart(&ctx->in,bVar12);
              if (bVar5) {
                Lexer::takeID((optional<wasm::Name> *)
                              ((long)&type_3.val.
                                      super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                                      super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>
                                      .
                                      super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>
                                      .
                                      super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>
                                      .
                                      super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>
                              + 0x20),&ctx->in);
                __return_storage_ptr___02 =
                     (__index_type *)
                     ((long)&_val_6.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x20);
                globaltype<wasm::WATParser::ParseModuleTypesCtx>
                          ((Result<wasm::WATParser::GlobalType> *)__return_storage_ptr___02,ctx);
                Result<wasm::WATParser::GlobalType>::Result
                          ((Result<wasm::WATParser::GlobalType> *)&err_6,
                           (Result<wasm::WATParser::GlobalType> *)__return_storage_ptr___02);
                pEVar10 = Result<wasm::WATParser::GlobalType>::getErr
                                    ((Result<wasm::WATParser::GlobalType> *)&err_6);
                if (pEVar10 != (Err *)0x0) {
                  wasm::Err::Err((Err *)((long)&_val_7.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                                 pEVar10);
                  MaybeResult<wasm::Ok>::MaybeResult
                            (__return_storage_ptr__,
                             (Err *)((long)&_val_7.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
                  wasm::Err::~Err((Err *)((long)&_val_7.val.super__Variant_base<wasm::Ok,_wasm::Err>
                                                 .super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20)
                                 );
                }
                _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
                _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = pEVar10 != (Err *)0x0;
                Result<wasm::WATParser::GlobalType>::~Result
                          ((Result<wasm::WATParser::GlobalType> *)&err_6);
                if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
                  bVar5 = std::optional::operator_cast_to_bool
                                    ((optional *)
                                     ((long)&type_3.val.
                                             super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>
                                             .
                                             super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>
                                             .
                                             super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>
                                             .
                                             super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>
                                             .
                                             super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>
                                     + 0x20));
                  if (bVar5) {
                    pNVar7 = std::optional<wasm::Name>::operator*
                                       ((optional<wasm::Name> *)
                                        ((long)&type_3.val.
                                                super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>
                                                .
                                                super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>
                                                .
                                                super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>
                                                .
                                                super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>
                                                .
                                                super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>
                                        + 0x20));
                    local_5c0.super_IString.str._M_len = (pNVar7->super_IString).str._M_len;
                    local_5c0.super_IString.str._M_str = (pNVar7->super_IString).str._M_str;
                  }
                  else {
                    wasm::Name::Name(&local_5c0);
                  }
                  local_5d8.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_5d8.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_5d8.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector(&local_5d8);
                  pGVar9 = Result<wasm::WATParser::GlobalType>::operator*
                                     ((Result<wasm::WATParser::GlobalType> *)
                                      ((long)&_val_6.val.
                                              super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>
                                              .
                                              super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>
                                              .
                                              super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>
                                              .
                                              super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>
                                              .
                                              super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>
                                      + 0x20));
                  local_5e8 = pGVar9->mutability;
                  uStack_5e4 = *(undefined4 *)&pGVar9->field_0x4;
                  uStack_5e0 = (undefined4)(pGVar9->type).id;
                  uStack_5dc = *(undefined4 *)((long)&(pGVar9->type).id + 4);
                  std::optional<wasm::Ok>::optional((optional<wasm::Ok> *)((long)&err_7 + 6));
                  NVar3.super_IString.str._M_str = local_5c0.super_IString.str._M_str;
                  NVar3.super_IString.str._M_len = local_5c0.super_IString.str._M_len;
                  type_00._4_4_ = uStack_5e4;
                  type_00.mutability = local_5e8;
                  type_00.type.id._0_4_ = uStack_5e0;
                  type_00.type.id._4_4_ = uStack_5dc;
                  ParseModuleTypesCtx::addGlobal
                            ((Result<wasm::Ok> *)local_5b0,ctx,NVar3,&local_5d8,
                             (ImportNames *)local_120,type_00,(optional<wasm::Ok>)err_7._6_2_,
                             local_20);
                  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector(&local_5d8);
                  local_5f8 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_5b0);
                  bVar5 = local_5f8 != (Err *)0x0;
                  if (bVar5) {
                    wasm::Err::Err(&local_618,local_5f8);
                    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_618);
                    wasm::Err::~Err(&local_618);
                  }
                  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
                  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = bVar5;
                  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_5b0);
                  if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
                    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 0;
                  }
                }
                Result<wasm::WATParser::GlobalType>::~Result
                          ((Result<wasm::WATParser::GlobalType> *)
                           ((long)&_val_6.val.
                                   super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                                   super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err> +
                           0x20));
              }
              else {
                bVar12 = sv("tag",3);
                bVar5 = Lexer::takeSExprStart(&ctx->in,bVar12);
                if (!bVar5) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_790,"expected import description",&local_791);
                  Lexer::err(&local_770,&ctx->in,&local_790);
                  MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_770);
                  wasm::Err::~Err(&local_770);
                  std::__cxx11::string::~string((string *)&local_790);
                  std::allocator<char>::~allocator(&local_791);
                  return __return_storage_ptr__;
                }
                Lexer::takeID((optional<wasm::Name> *)
                              ((long)&type_4.val.
                                      super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> +
                              0x20),&ctx->in);
                p_Var1 = (__index_type *)
                         ((long)&_val_8.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>
                                 .super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20)
                ;
                typeuse<wasm::WATParser::ParseModuleTypesCtx>
                          ((Result<wasm::WATParser::TypeUse> *)p_Var1,ctx,true);
                Result<wasm::WATParser::TypeUse>::Result
                          ((Result<wasm::WATParser::TypeUse> *)&err_8,
                           (Result<wasm::WATParser::TypeUse> *)p_Var1);
                pEVar10 = Result<wasm::WATParser::TypeUse>::getErr
                                    ((Result<wasm::WATParser::TypeUse> *)&err_8);
                if (pEVar10 != (Err *)0x0) {
                  wasm::Err::Err((Err *)((long)&_val_9.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                                 pEVar10);
                  MaybeResult<wasm::Ok>::MaybeResult
                            (__return_storage_ptr__,
                             (Err *)((long)&_val_9.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
                  wasm::Err::~Err((Err *)((long)&_val_9.val.super__Variant_base<wasm::Ok,_wasm::Err>
                                                 .super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20)
                                 );
                }
                _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
                _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = pEVar10 != (Err *)0x0;
                Result<wasm::WATParser::TypeUse>::~Result
                          ((Result<wasm::WATParser::TypeUse> *)&err_8);
                if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
                  bVar5 = std::optional::operator_cast_to_bool
                                    ((optional *)
                                     ((long)&type_4.val.
                                             super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>
                                             .
                                             super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                             .
                                             super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                             .
                                             super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                             .
                                             super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                     + 0x20));
                  if (bVar5) {
                    pNVar7 = std::optional<wasm::Name>::operator*
                                       ((optional<wasm::Name> *)
                                        ((long)&type_4.val.
                                                super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>
                                                .
                                                super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                                .
                                                super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                                .
                                                super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                                .
                                                super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                        + 0x20));
                    local_6f0.super_IString.str._M_len = (pNVar7->super_IString).str._M_len;
                    local_6f0.super_IString.str._M_str = (pNVar7->super_IString).str._M_str;
                  }
                  else {
                    wasm::Name::Name(&local_6f0);
                  }
                  local_708.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_708.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_708.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector(&local_708);
                  pTVar11 = Result<wasm::WATParser::TypeUse>::operator*
                                      ((Result<wasm::WATParser::TypeUse> *)
                                       ((long)&_val_8.val.
                                               super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>
                                               .
                                               super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                               .
                                               super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                               .
                                               super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                               .
                                               super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                       + 0x20));
                  TypeUse::TypeUse((TypeUse *)&err_9,pTVar11);
                  NVar2.super_IString.str._M_str = local_6f0.super_IString.str._M_str;
                  NVar2.super_IString.str._M_len = local_6f0.super_IString.str._M_len;
                  ParseModuleTypesCtx::addTag
                            ((Result<wasm::Ok> *)local_6e0,ctx,NVar2,&local_708,
                             (ImportNames *)local_120,(TypeUse *)&err_9,local_20);
                  TypeUse::~TypeUse((TypeUse *)&err_9);
                  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector(&local_708);
                  local_730 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_6e0);
                  bVar5 = local_730 != (Err *)0x0;
                  if (bVar5) {
                    wasm::Err::Err(&local_750,local_730);
                    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_750);
                    wasm::Err::~Err(&local_750);
                  }
                  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
                  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = bVar5;
                  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_6e0);
                  if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
                    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 0;
                  }
                }
                Result<wasm::WATParser::TypeUse>::~Result
                          ((Result<wasm::WATParser::TypeUse> *)
                           ((long)&_val_8.val.
                                   super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                   super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> +
                           0x20));
              }
            }
          }
        }
        if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
          bVar5 = Lexer::takeRParen(&ctx->in);
          if (bVar5) {
            bVar5 = Lexer::takeRParen(&ctx->in);
            if (bVar5) {
              MaybeResult<wasm::Ok>::MaybeResult<wasm::Ok>(__return_storage_ptr__,&local_822);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_820,"expected end of import",&local_821);
              Lexer::err(&local_800,&ctx->in,&local_820);
              MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_800);
              wasm::Err::~Err(&local_800);
              std::__cxx11::string::~string((string *)&local_820);
              std::allocator<char>::~allocator(&local_821);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_7d8,"expected end of import description",&local_7d9);
            Lexer::err(&local_7b8,&ctx->in,&local_7d8);
            MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_7b8);
            wasm::Err::~Err(&local_7b8);
            std::__cxx11::string::~string((string *)&local_7d8);
            std::allocator<char>::~allocator(&local_7d9);
          }
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,"expected import name",
                   (allocator<char> *)((long)&names.nm.super_IString.str._M_str + 7));
        Lexer::err(&local_d8,&ctx->in,&local_f8);
        MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_d8);
        wasm::Err::~Err(&local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)((long)&names.nm.super_IString.str._M_str + 7));
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"expected import module name",&local_89);
      Lexer::err(&local_68,&ctx->in,&local_88);
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_68);
      wasm::Err::~Err(&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator(&local_89);
    }
  }
  else {
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> import_(Ctx& ctx) {
  auto pos = ctx.in.getPos();

  if (!ctx.in.takeSExprStart("import"sv)) {
    return {};
  }

  auto mod = ctx.in.takeName();
  if (!mod) {
    return ctx.in.err("expected import module name");
  }

  auto nm = ctx.in.takeName();
  if (!nm) {
    return ctx.in.err("expected import name");
  }
  ImportNames names{*mod, *nm};

  if (ctx.in.takeSExprStart("func"sv)) {
    auto name = ctx.in.takeID();
    auto type = typeuse(ctx);
    CHECK_ERR(type);
    // TODO: function import annotations
    CHECK_ERR(ctx.addFunc(
      name ? *name : Name{}, {}, &names, *type, std::nullopt, {}, pos));
  } else if (ctx.in.takeSExprStart("table"sv)) {
    auto name = ctx.in.takeID();
    auto type = tabletype(ctx);
    CHECK_ERR(type);
    CHECK_ERR(ctx.addTable(name ? *name : Name{}, {}, &names, *type, pos));
  } else if (ctx.in.takeSExprStart("memory"sv)) {
    auto name = ctx.in.takeID();
    auto type = memtype(ctx);
    CHECK_ERR(type);
    CHECK_ERR(ctx.addMemory(name ? *name : Name{}, {}, &names, *type, pos));
  } else if (ctx.in.takeSExprStart("global"sv)) {
    auto name = ctx.in.takeID();
    auto type = globaltype(ctx);
    CHECK_ERR(type);
    CHECK_ERR(ctx.addGlobal(
      name ? *name : Name{}, {}, &names, *type, std::nullopt, pos));
  } else if (ctx.in.takeSExprStart("tag"sv)) {
    auto name = ctx.in.takeID();
    auto type = typeuse(ctx);
    CHECK_ERR(type);
    CHECK_ERR(ctx.addTag(name ? *name : Name{}, {}, &names, *type, pos));
  } else {
    return ctx.in.err("expected import description");
  }

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of import description");
  }
  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of import");
  }

  return Ok{};
}